

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O2

void __thiscall Bracket::~Bracket(Bracket *this)

{
  list<Atom_*,_std::allocator<Atom_*>_> *this_00;
  _List_node_base *p_Var1;
  
  (this->super_Atom)._vptr_Atom = (_func_int **)&PTR__Bracket_00108c40;
  this_00 = &this->para;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<Atom_*,_std::allocator<Atom_*>_> *)&p_Var1->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var1 != (_List_node_base *)this_00) {
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_next + 8))();
      p_Var1[1]._M_next = (_List_node_base *)0x0;
    }
  }
  std::__cxx11::_List_base<Atom_*,_std::allocator<Atom_*>_>::_M_clear
            (&this_00->super__List_base<Atom_*,_std::allocator<Atom_*>_>);
  std::__cxx11::string::~string((string *)&this->func);
  return;
}

Assistant:

Bracket::~Bracket() {
    auto cursor = para.begin();
    while (cursor != para.end()) {
        if (*cursor != NULL) {
            delete *cursor;
            *cursor = NULL;
        }
        cursor++;
    }
}